

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Specific.hh
# Opt level: O3

void avro::
     codec_traits<std::vector<uau::_union_array_union_Union__0__,_std::allocator<uau::_union_array_union_Union__0__>_>_>
     ::decode(Decoder *d,
             vector<uau::_union_array_union_Union__0__,_std::allocator<uau::_union_array_union_Union__0__>_>
             *s)

{
  pointer p_Var1;
  pointer p_Var2;
  placeholder *ppVar3;
  long lVar4;
  pointer p_Var5;
  _union_array_union_Union__0__ t;
  _union_array_union_Union__0__ local_38;
  
  p_Var1 = (s->
           super__Vector_base<uau::_union_array_union_Union__0__,_std::allocator<uau::_union_array_union_Union__0__>_>
           )._M_impl.super__Vector_impl_data._M_start;
  p_Var2 = (s->
           super__Vector_base<uau::_union_array_union_Union__0__,_std::allocator<uau::_union_array_union_Union__0__>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  p_Var5 = p_Var1;
  if (p_Var2 != p_Var1) {
    do {
      ppVar3 = (p_Var5->value_).content;
      if (ppVar3 != (placeholder *)0x0) {
        (*ppVar3->_vptr_placeholder[1])();
      }
      p_Var5 = p_Var5 + 1;
    } while (p_Var5 != p_Var2);
    (s->
    super__Vector_base<uau::_union_array_union_Union__0__,_std::allocator<uau::_union_array_union_Union__0__>_>
    )._M_impl.super__Vector_impl_data._M_finish = p_Var1;
  }
  lVar4 = (**(code **)(*(long *)d + 0x80))(d);
  while (lVar4 != 0) {
    do {
      local_38.idx_ = 0;
      local_38.value_.content = (placeholder *)0x0;
      codec_traits<uau::_union_array_union_Union__0__>::decode(d,&local_38);
      std::
      vector<uau::_union_array_union_Union__0__,_std::allocator<uau::_union_array_union_Union__0__>_>
      ::push_back(s,&local_38);
      if (local_38.value_.content != (placeholder *)0x0) {
        (*(local_38.value_.content)->_vptr_placeholder[1])();
      }
      lVar4 = lVar4 + -1;
    } while (lVar4 != 0);
    lVar4 = (**(code **)(*(long *)d + 0x88))(d);
  }
  return;
}

Assistant:

static void decode(Decoder& d, std::vector<T>& s) {
        s.clear();
        for (size_t n = d.arrayStart(); n != 0; n = d.arrayNext()) {
            for (size_t i = 0; i < n; ++i) {
                T t;
                avro::decode(d, t);
                s.push_back(t);
            }
        }
    }